

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

NodePtr HighsHashTree<int,_int>::copy_recurse(NodePtr node)

{
  long *plVar1;
  long *__dest;
  NodePtr NVar2;
  logic_error *this;
  long lVar3;
  long *plVar4;
  long *plVar5;
  int i;
  long lVar6;
  byte bVar7;
  ulong uStack_30;
  
  bVar7 = 0;
  switch((uint)node.ptrAndType & 7) {
  case 0:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Unexpected node type in empty in hash tree");
    goto LAB_002835b5;
  case 1:
    plVar4 = (long *)(node.ptrAndType & 0xfffffffffffffff8);
    __dest = (long *)operator_new(0x18);
    lVar3 = plVar4[1];
    *__dest = *plVar4;
    __dest[1] = lVar3;
    __dest[2] = plVar4[2];
    uStack_30 = 1;
    plVar5 = __dest;
    do {
      plVar1 = (long *)operator_new(0x10);
      lVar3 = ((long *)*plVar4)[1];
      *plVar1 = *(long *)*plVar4;
      plVar1[1] = lVar3;
      *plVar5 = (long)plVar1;
      plVar4 = (long *)*plVar4;
      plVar5 = plVar1;
    } while (*plVar4 != 0);
    break;
  case 2:
    __dest = (long *)operator_new(0x78);
    plVar4 = (long *)(node.ptrAndType & 0xfffffffffffffff8);
    plVar5 = __dest;
    for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
      *plVar5 = *plVar4;
      plVar4 = plVar4 + (ulong)bVar7 * -2 + 1;
      plVar5 = plVar5 + (ulong)bVar7 * -2 + 1;
    }
    uStack_30 = 2;
    break;
  case 3:
    __dest = (long *)operator_new(0x178);
    memcpy(__dest,(void *)(node.ptrAndType & 0xfffffffffffffff8),0x178);
    uStack_30 = 3;
    break;
  case 4:
    __dest = (long *)operator_new(0x278);
    memcpy(__dest,(void *)(node.ptrAndType & 0xfffffffffffffff8),0x278);
    uStack_30 = 4;
    break;
  case 5:
    __dest = (long *)operator_new(0x378);
    memcpy(__dest,(void *)(node.ptrAndType & 0xfffffffffffffff8),0x378);
    uStack_30 = 5;
    break;
  case 6:
    plVar4 = (long *)(node.ptrAndType & 0xfffffffffffffff8);
    lVar3 = *plVar4;
    __dest = (long *)operator_new((ulong)((int)POPCOUNT(lVar3) * 8 + 0x47U & 0xffffffc0));
    *__dest = *plVar4;
    uStack_30 = 6;
    for (lVar6 = 0; POPCOUNT(lVar3) != lVar6; lVar6 = lVar6 + 1) {
      NVar2 = copy_recurse((NodePtr)plVar4[lVar6 + 1]);
      __dest[lVar6 + 1] = NVar2.ptrAndType;
    }
    break;
  case 7:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Unexpected type in hash tree");
LAB_002835b5:
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return (NodePtr)((ulong)__dest | uStack_30);
}

Assistant:

static NodePtr copy_recurse(NodePtr node) {
    switch (node.getType()) {
      case kEmpty:
        throw std::logic_error("Unexpected node type in empty in hash tree");
      case kListLeaf: {
        ListLeaf* leaf = node.getListLeaf();

        ListLeaf* copyLeaf = new ListLeaf(*leaf);

        ListNode* iter = &leaf->first;
        ListNode* copyIter = &copyLeaf->first;
        do {
          copyIter->next = new ListNode(*iter->next);
          iter = iter->next;
          copyIter = copyIter->next;
        } while (iter->next != nullptr);

        return copyLeaf;
      }
      case kInnerLeafSizeClass1: {
        InnerLeaf<1>* leaf = node.getInnerLeafSizeClass1();
        return new InnerLeaf<1>(*leaf);
      }
      case kInnerLeafSizeClass2: {
        InnerLeaf<2>* leaf = node.getInnerLeafSizeClass2();
        return new InnerLeaf<2>(*leaf);
      }
      case kInnerLeafSizeClass3: {
        InnerLeaf<3>* leaf = node.getInnerLeafSizeClass3();
        return new InnerLeaf<3>(*leaf);
      }
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = node.getInnerLeafSizeClass4();
        return new InnerLeaf<4>(*leaf);
      }
      case kBranchNode: {
        BranchNode* branch = node.getBranchNode();
        int size = branch->occupation.num_set();
        BranchNode* newBranch =
            (BranchNode*)::operator new(getBranchNodeSize(size));
        newBranch->occupation = branch->occupation;
        for (int i = 0; i < size; ++i)
          newBranch->child[i] = copy_recurse(branch->child[i]);

        return newBranch;
      }
      default:
        throw std::logic_error("Unexpected type in hash tree");
    }
  }